

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O3

UChar32 __thiscall
icu_63::FCDUTF8CollationIterator::nextCodePoint
          (FCDUTF8CollationIterator *this,UErrorCode *errorCode)

{
  byte bVar1;
  short sVar2;
  int offset;
  int32_t iVar3;
  uint8_t *puVar4;
  UBool UVar5;
  State SVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  
LAB_00228e41:
  switch(this->state) {
  case CHECK_FWD:
    uVar15 = (this->super_UTF8CollationIterator).pos;
    lVar12 = (long)(int)uVar15;
    uVar7 = (this->super_UTF8CollationIterator).length;
    if (uVar15 == uVar7) {
      return -1;
    }
    puVar4 = (this->super_UTF8CollationIterator).u8;
    bVar1 = puVar4[lVar12];
    if (((int)uVar7 < 0) && (bVar1 == 0)) {
      return -1;
    }
    if (-1 < (char)bVar1) {
      uVar7 = (uint)bVar1;
      iVar8 = uVar15 + 1;
LAB_00229177:
      (this->super_UTF8CollationIterator).pos = iVar8;
      return uVar7;
    }
    uVar13 = lVar12 + 1;
    (this->super_UTF8CollationIterator).pos = (uint)uVar13;
    bVar1 = puVar4[lVar12];
    uVar15 = (uint)bVar1;
    uVar9 = uVar15;
    if ((char)bVar1 < '\0') {
      uVar10 = 0xfffd;
      if ((uint)uVar13 == uVar7) {
LAB_00228f44:
        uVar13 = (ulong)uVar7;
      }
      else if (bVar1 < 0xe0) {
        if (0xc1 < bVar1) {
          uVar11 = uVar15 & 0x1f;
LAB_0022907c:
          if ((byte)(puVar4[(int)uVar13] ^ 0x80) < 0x40) {
            uVar9 = uVar11 << 6 | puVar4[(int)uVar13] ^ 0x80;
            uVar15 = (int)uVar13 + 1;
            uVar13 = (ulong)uVar15;
            (this->super_UTF8CollationIterator).pos = uVar15;
            uVar15 = (uVar11 >> 4) + 0xd7c0 & 0xffff;
            if (uVar11 < 0x400) {
              uVar15 = uVar9;
            }
            goto LAB_00228eb0;
          }
        }
      }
      else if (bVar1 < 0xf0) {
        uVar15 = uVar15 & 0xf;
        if (((byte)" 000000000000\x1000"[uVar15] >> (puVar4[uVar13] >> 5) & 1) != 0) {
          bVar14 = puVar4[uVar13] & 0x3f;
LAB_0022904b:
          uVar9 = (int)uVar13 + 1;
          uVar13 = (ulong)uVar9;
          (this->super_UTF8CollationIterator).pos = uVar9;
          if (uVar9 != uVar7) {
            uVar11 = (uint)bVar14 | uVar15 << 6;
            goto LAB_0022907c;
          }
          goto LAB_00228f44;
        }
      }
      else if (bVar1 < 0xf5) {
        bVar1 = puVar4[uVar13];
        if (((uint)(int)""[bVar1 >> 4] >> (uVar15 - 0xf0 & 0x1f) & 1) != 0) {
          uVar13 = lVar12 + 2;
          (this->super_UTF8CollationIterator).pos = (uint)uVar13;
          if ((uint)uVar13 == uVar7) goto LAB_00228f44;
          bVar14 = puVar4[uVar13] + 0x80;
          if (bVar14 < 0x40) {
            uVar15 = bVar1 & 0x3f | (uVar15 - 0xf0) * 0x40;
            uVar13 = uVar13 & 0xffffffff;
            goto LAB_0022904b;
          }
          uVar13 = uVar13 & 0xffffffff;
        }
      }
      uVar11 = (uint)uVar13;
      uVar9 = 0xfffd;
    }
    else {
LAB_00228eb0:
      uVar11 = (uint)uVar13;
      uVar10 = uVar15;
      if ((int)uVar15 < 0xc0) {
        return uVar9;
      }
    }
    if ((ulong)(byte)CollationFCD::tcccIndex[uVar10 >> 5] == 0) {
      return uVar9;
    }
    if ((*(uint *)(CollationFCD::tcccBits + (ulong)(byte)CollationFCD::tcccIndex[uVar10 >> 5] * 4)
         >> (uVar10 & 0x1f) & 1) == 0) {
      return uVar9;
    }
    if ((uVar9 & 0x1fff01) == 0xf01) {
LAB_00228f84:
      uVar7 = 0xfffffffd;
      if ((0xd7ff < uVar9) && (uVar7 = 0, 0xffefdfff < uVar9 - 0x110000)) {
        uVar7 = uVar9 < 0x10000 | 0xfffffffc;
      }
    }
    else {
      if (uVar11 == uVar7) {
        return uVar9;
      }
      UVar5 = nextHasLccc(this);
      if (UVar5 == '\0') {
        return uVar9;
      }
      uVar7 = 0xffffffff;
      if ((0x7f < uVar9) && (uVar7 = 0xfffffffe, 0x7ff < uVar9)) goto LAB_00228f84;
    }
    (this->super_UTF8CollationIterator).pos = uVar11 + uVar7;
    UVar5 = nextSegment(this,errorCode);
    if (UVar5 == '\0') {
      return -1;
    }
    goto LAB_00228e41;
  case CHECK_BWD:
    iVar8 = (this->super_UTF8CollationIterator).pos;
    this->start = iVar8;
    SVar6 = (uint)(iVar8 != this->limit) * 2;
    break;
  case IN_FCD_SEGMENT:
    iVar8 = (this->super_UTF8CollationIterator).pos;
    lVar12 = (long)iVar8;
    SVar6 = CHECK_FWD;
    if (iVar8 != this->limit) {
      puVar4 = (this->super_UTF8CollationIterator).u8;
      uVar13 = lVar12 + 1;
      (this->super_UTF8CollationIterator).pos = (uint)uVar13;
      bVar1 = puVar4[lVar12];
      uVar7 = (uint)bVar1;
      if (-1 < (char)bVar1) {
        return uVar7;
      }
      uVar15 = (this->super_UTF8CollationIterator).length;
      if ((uint)uVar13 == uVar15) {
        return 0xfffd;
      }
      if (bVar1 < 0xe0) {
        if (bVar1 < 0xc2) {
          return 0xfffd;
        }
        uVar7 = uVar7 & 0x1f;
      }
      else {
        if (bVar1 < 0xf0) {
          uVar7 = uVar7 & 0xf;
          if (((byte)" 000000000000\x1000"[uVar7] >> (puVar4[uVar13] >> 5) & 1) == 0) {
            return 0xfffd;
          }
          bVar14 = puVar4[uVar13] & 0x3f;
        }
        else {
          if (0xf4 < bVar1) {
            return 0xfffd;
          }
          bVar1 = puVar4[uVar13];
          if (((uint)(int)""[bVar1 >> 4] >> (uVar7 - 0xf0 & 0x1f) & 1) == 0) {
            return 0xfffd;
          }
          uVar13 = lVar12 + 2;
          (this->super_UTF8CollationIterator).pos = (uint)uVar13;
          if ((uint)uVar13 == uVar15) {
            return 0xfffd;
          }
          bVar14 = puVar4[uVar13] + 0x80;
          if (0x3f < bVar14) {
            return 0xfffd;
          }
          uVar7 = bVar1 & 0x3f | (uVar7 - 0xf0) * 0x40;
          uVar13 = uVar13 & 0xffffffff;
        }
        uVar9 = (int)uVar13 + 1;
        uVar13 = (ulong)uVar9;
        (this->super_UTF8CollationIterator).pos = uVar9;
        if (uVar9 == uVar15) {
          return 0xfffd;
        }
        uVar7 = (uint)bVar14 | uVar7 << 6;
      }
      if (0x3f < (byte)(puVar4[(int)uVar13] ^ 0x80)) {
        return 0xfffd;
      }
      uVar7 = uVar7 << 6 | puVar4[(int)uVar13] ^ 0x80;
      iVar8 = (int)uVar13 + 1;
      goto LAB_00229177;
    }
    break;
  case IN_NORMALIZED:
    sVar2 = (this->normalized).fUnion.fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar8 = (this->normalized).fUnion.fFields.fLength;
    }
    else {
      iVar8 = (int)sVar2 >> 5;
    }
    offset = (this->super_UTF8CollationIterator).pos;
    if (offset != iVar8) {
      uVar7 = UnicodeString::char32At(&this->normalized,offset);
      iVar8 = ((this->super_UTF8CollationIterator).pos - (uint)(uVar7 < 0x10000)) + 2;
      goto LAB_00229177;
    }
  default:
    iVar3 = this->limit;
    (this->super_UTF8CollationIterator).pos = iVar3;
    this->start = iVar3;
    SVar6 = CHECK_FWD;
  }
  this->state = SVar6;
  goto LAB_00228e41;
}

Assistant:

UChar32
FCDUTF8CollationIterator::nextCodePoint(UErrorCode &errorCode) {
    UChar32 c;
    for(;;) {
        if(state == CHECK_FWD) {
            if(pos == length || ((c = u8[pos]) == 0 && length < 0)) {
                return U_SENTINEL;
            }
            if(U8_IS_SINGLE(c)) {
                ++pos;
                return c;
            }
            U8_NEXT_OR_FFFD(u8, pos, length, c);
            if(CollationFCD::hasTccc(c <= 0xffff ? c : U16_LEAD(c)) &&
                    (CollationFCD::maybeTibetanCompositeVowel(c) ||
                        (pos != length && nextHasLccc()))) {
                // c is not FCD-inert, therefore it is not U+FFFD and it has a valid byte sequence
                // and we can use U8_LENGTH() rather than a previous-position variable.
                pos -= U8_LENGTH(c);
                if(!nextSegment(errorCode)) {
                    return U_SENTINEL;
                }
                continue;
            }
            return c;
        } else if(state == IN_FCD_SEGMENT && pos != limit) {
            U8_NEXT_OR_FFFD(u8, pos, length, c);
            return c;
        } else if(state == IN_NORMALIZED && pos != normalized.length()) {
            c = normalized.char32At(pos);
            pos += U16_LENGTH(c);
            return c;
        } else {
            switchToForward();
        }
    }
}